

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::DeleteTexture::exec(DeleteTexture *this,Thread *t)

{
  deUint32 err;
  deBool dVar1;
  Texture *pTVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_358;
  MessageBuilder local_1b8;
  GLuint local_24;
  Thread *pTStack_20;
  GLuint tex;
  EGLThread *thread;
  Thread *t_local;
  DeleteTexture *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  pTStack_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0)
  ;
  if (pTStack_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  pTVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  local_24 = pTVar2->texture;
  tcu::ThreadUtil::Thread::newMessage(&local_1b8,pTStack_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [32])"Begin -- glDeleteTextures(1, { ");
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&local_24);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x57e0e8);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b8);
  do {
    (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x480))(1,&local_24);
    err = (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"deleteTextures(1, &tex)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x3ab);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_358,pTStack_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_358,(char (*) [26])"End -- glDeleteTextures()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_358);
  pTVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  pTVar2->texture = 0;
  return;
}

Assistant:

void DeleteTexture::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint tex = m_texture->texture;

	thread.newMessage() << "Begin -- glDeleteTextures(1, { " << tex << " })" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, deleteTextures(1, &tex));
	thread.newMessage() << "End -- glDeleteTextures()" << tcu::ThreadUtil::Message::End;

	m_texture->texture = 0;
}